

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_serialization_unit_test.cpp
# Opt level: O2

Vector_filtration_value *
random_filtration_vec<Gudhi::Vector_filtration_value>
          (Vector_filtration_value *__return_storage_ptr__,value_type_conflict1 lower_bound,
          value_type_conflict1 upper_bound,uint number_of_parameters)

{
  uint uVar1;
  result_type rVar2;
  uint i;
  ulong uVar3;
  uniform_int_distribution<int> unif;
  random_device rand_dev;
  mt19937 rand_engine;
  uniform_int_distribution<int> local_2748;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_2748._M_param._M_a = lower_bound;
  local_2748._M_param._M_b = upper_bound;
  std::random_device::random_device(&local_2740);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13b8,(ulong)uVar1);
  Gudhi::Vector_filtration_value::Vector_filtration_value
            (__return_storage_ptr__,(ulong)number_of_parameters);
  for (uVar3 = 0; number_of_parameters != uVar3; uVar3 = uVar3 + 1) {
    rVar2 = std::uniform_int_distribution<int>::operator()(&local_2748,&local_13b8);
    (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar3] =
         rVar2;
  }
  std::random_device::~random_device(&local_2740);
  return __return_storage_ptr__;
}

Assistant:

Filtration_type random_filtration_vec(typename Filtration_type::value_type lower_bound = 0,
                                      typename Filtration_type::value_type upper_bound = 10,
                                      unsigned int number_of_parameters = 2)
{
  std::uniform_int_distribution<typename Filtration_type::value_type> unif(lower_bound, upper_bound);
  std::random_device rand_dev;
  std::mt19937 rand_engine(rand_dev());

  Filtration_type res(number_of_parameters);
  for (unsigned int i = 0; i < number_of_parameters; ++i) res[i] = unif(rand_engine);

  return res;
}